

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O3

sequence * toml::detail::syntax::hex_int(sequence *__return_storage_ptr__,spec *s)

{
  pointer __p;
  repeat_at_least local_150;
  either local_138;
  character local_118;
  literal local_108;
  sequence local_f0;
  hexdig local_d0;
  hexdig local_a8;
  digit local_80;
  hexdig local_68;
  character_in_range local_40;
  character_in_range local_30;
  
  local_108.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004df9f8;
  local_108.value_ = "0x";
  local_108.size_ = 2;
  local_68.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__hexdig_004e0778;
  local_a8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004e07d0;
  local_a8.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_004df9a0;
  local_a8.scanner_.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start._0_2_ = 0x3930;
  local_d0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004df9a0;
  local_d0.scanner_.super_scanner_base._vptr_scanner_base._0_2_ = 0x6661;
  local_138.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004df9a0;
  local_138.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_138.others_.
                         super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                         ._M_impl.super__Vector_impl_data._M_start._2_6_,0x4641);
  either::
  either<toml::detail::syntax::digit,toml::detail::character_in_range,toml::detail::character_in_range>
            (&local_68.scanner_,(digit *)&local_a8,(character_in_range *)&local_d0,
             (character_in_range *)&local_138);
  local_a8.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__hexdig_004e0778;
  local_d0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004e07d0;
  local_d0.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_004df9a0;
  local_d0.scanner_.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start._0_2_ = 0x3930;
  local_f0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004df9a0;
  local_f0.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start._0_2_ = 0x6661;
  local_80.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004df9a0;
  local_80.scanner_.super_scanner_base._vptr_scanner_base._0_2_ = 0x4641;
  either::
  either<toml::detail::syntax::digit,toml::detail::character_in_range,toml::detail::character_in_range>
            (&local_a8.scanner_,(digit *)&local_d0,(character_in_range *)&local_f0,
             (character_in_range *)&local_80);
  local_118.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004df8e0;
  local_118.value_ = '_';
  local_d0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__hexdig_004e0778;
  local_80.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_004e07d0;
  local_80.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_004df9a0;
  local_80.scanner_.from_ = '0';
  local_80.scanner_.to_ = '9';
  local_30.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004df9a0;
  local_30.from_ = 'a';
  local_30.to_ = 'f';
  local_40.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_004df9a0;
  local_40.from_ = 'A';
  local_40.to_ = 'F';
  either::
  either<toml::detail::syntax::digit,toml::detail::character_in_range,toml::detail::character_in_range>
            (&local_d0.scanner_,&local_80,&local_30,&local_40);
  sequence::sequence<toml::detail::character,toml::detail::syntax::hexdig>
            (&local_f0,&local_118,&local_d0);
  either::either<toml::detail::syntax::hexdig,toml::detail::sequence>
            (&local_138,&local_a8,&local_f0);
  local_150.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_at_least_004dfb58;
  local_150.length_ = 0;
  local_150.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       operator_new(0x20);
  *(undefined ***)
   local_150.other_.scanner_._M_t.
   super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
   ._M_t.
   super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
   .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl = &PTR__either_004dfaa8;
  *(pointer *)
   ((long)local_150.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 8) =
       local_138.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)local_150.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x10) =
       local_138.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)local_150.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x18) =
       local_138.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_138.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.super_scanner_base._vptr_scanner_base = (_func_int **)0x0;
  std::unique_ptr<toml::detail::either,_std::default_delete<toml::detail::either>_>::~unique_ptr
            ((unique_ptr<toml::detail::either,_std::default_delete<toml::detail::either>_> *)
             &local_80);
  sequence::
  sequence<toml::detail::literal,toml::detail::syntax::hexdig,toml::detail::repeat_at_least>
            (__return_storage_ptr__,&local_108,&local_68,&local_150);
  if (local_150.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_150.other_.scanner_._M_t.
                          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl +
                8))();
  }
  local_150.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_138.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_f0.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_d0.scanner_.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_a8.scanner_.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_68.scanner_.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence hex_int(const spec& s)
{
    return sequence(
            literal("0x"),
            hexdig(s),
            repeat_at_least(0,
                either(
                    hexdig(s),
                    sequence(character(char_type('_')), hexdig(s))
                )
            )
        );
}